

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int If_ManSatDeriveGiaFromBits
              (void *pGia,Ifn_Ntk_t *p,word *pConfigData,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  word *pwVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  word uTruth;
  Vec_Int_t Leaves;
  int pFaninLits [16];
  int pVarMap [1000];
  ulong local_1070;
  int local_1064;
  Ifn_Ntk_t *local_1060;
  Gia_Man_t *local_1058;
  Ifn_Obj_t *local_1050;
  word local_1048;
  ulong local_1040;
  Vec_Int_t *local_1038;
  ulong local_1030;
  Vec_Int_t local_1028;
  uint local_1018 [15];
  uint auStack_fdc [1003];
  
  uVar20 = p->nInps;
  uVar17 = uVar20 + 1;
  if (1 < uVar17) {
    if ((ulong)uVar20 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar17 == 0; uVar17 = uVar17 - 1) {
        }
      }
      uVar17 = (uVar17 ^ 0xffffffe0) + 0x21;
    }
  }
  iVar3 = vLeaves->nSize;
  local_1058 = (Gia_Man_t *)pGia;
  local_1038 = vCover;
  if (((int)uVar20 < iVar3) || (999 < p->nParsVIni)) {
    __assert_fail("Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x2ed,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  local_1064 = p->nParsVIni - p->nObjs;
  iVar18 = uVar17 + 1;
  uVar17 = iVar18 * uVar20 + local_1064;
  local_1040 = (ulong)uVar17;
  local_1048 = pConfigData[(int)uVar17 >> 6];
  if (0 < (int)uVar20) {
    uVar15 = 0;
    iVar14 = local_1064;
    do {
      iVar7 = 0;
      uVar17 = 0;
      do {
        uVar2 = 1 << ((byte)iVar7 & 0x1f);
        if ((pConfigData[iVar14 + iVar7 >> 6] >> ((ulong)(uint)(iVar14 + iVar7) & 0x3f) & 1) == 0) {
          uVar2 = 0;
        }
        uVar17 = uVar17 | uVar2;
        iVar7 = iVar7 + 1;
      } while (iVar18 != iVar7);
      if ((int)uVar17 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (iVar3 <= (int)(uVar17 >> 1)) {
        __assert_fail("Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2f3,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (vLeaves->pArray[uVar17 >> 1] < 0) goto LAB_0043b904;
      auStack_fdc[uVar15 + 1] = vLeaves->pArray[uVar17 >> 1] ^ uVar17 & 1;
      uVar15 = uVar15 + 1;
      iVar14 = iVar14 + iVar18;
    } while (uVar15 != uVar20);
  }
  iVar3 = p->nObjs;
  iVar18 = 0;
  if ((int)uVar20 < iVar3) {
    local_1050 = p->Nodes;
    lVar13 = (long)(int)uVar20;
    piVar10 = p->Nodes[lVar13].Fanins;
    uVar15 = 0;
    local_1060 = p;
    do {
      uVar20 = *(uint *)(local_1050 + lVar13) >> 3 & 0x1f;
      if (6 < uVar20) {
        __assert_fail("nFans <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2fc,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      switch(*(uint *)(local_1050 + lVar13) & 7) {
      case 3:
        if (uVar20 == 0) {
          uVar17 = 1;
        }
        else {
          uVar17 = 1;
          uVar4 = 0;
          do {
            uVar17 = Gia_ManHashAnd((Gia_Man_t *)pGia,uVar17,auStack_fdc[(long)piVar10[uVar4] + 1]);
            uVar4 = uVar4 + 1;
          } while (uVar20 != uVar4);
        }
        goto LAB_0043b848;
      case 4:
        if (uVar20 == 0) {
          uVar17 = 0;
        }
        else {
          uVar4 = 0;
          uVar17 = 0;
          do {
            uVar17 = Gia_ManHashXor((Gia_Man_t *)pGia,uVar17,auStack_fdc[(long)piVar10[uVar4] + 1]);
            uVar4 = uVar4 + 1;
          } while (uVar20 != uVar4);
        }
LAB_0043b848:
        auStack_fdc[lVar13 + 1] = uVar17;
        break;
      case 5:
        if (uVar20 != 3) {
          __assert_fail("nFans == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x30d,
                        "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar20 = Gia_ManHashMux((Gia_Man_t *)pGia,
                                auStack_fdc[(long)local_1050[lVar13].Fanins[0] + 1],
                                auStack_fdc[(long)local_1050[lVar13].Fanins[1] + 1],
                                auStack_fdc[(long)local_1050[lVar13].Fanins[2] + 1]);
        auStack_fdc[lVar13 + 1] = uVar20;
        break;
      case 6:
        local_1070 = 0;
        uVar15 = uVar15 & 0xffffffff;
        uVar19 = 0;
        uVar4 = 0;
        do {
          if ((pConfigData[(int)(uVar15 + uVar19) >> 6] >> (uVar15 + uVar19 & 0x3f) & 1) != 0) {
            uVar4 = uVar4 | 1L << (uVar19 & 0x3f);
            local_1070 = uVar4;
          }
          uVar19 = uVar19 + 1;
        } while ((uint)uVar19 >> (sbyte)uVar20 == 0);
        uVar17 = uVar20;
        if (uVar20 < 2) {
          uVar17 = 2;
        }
        uVar2 = uVar17;
        if (uVar17 == 2) {
          uVar2 = 3;
        }
        uVar8 = uVar2;
        if (uVar2 == 3) {
          uVar8 = 4;
        }
        uVar1 = uVar8;
        if (uVar8 == 4) {
          uVar1 = 5;
        }
        if (1 < uVar1 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar12 = ((uint)local_1070 & 1) * 3;
        if (uVar20 != 0) {
          uVar12 = (uint)local_1070;
        }
        uVar4 = (ulong)(uVar12 & 3) * 5;
        if (1 < uVar20) {
          uVar4 = local_1070;
        }
        uVar12 = (uint)uVar4 & 0xf;
        uVar5 = (ulong)(uVar12 << 4 | uVar12);
        if (uVar17 != 2) {
          uVar5 = uVar4;
        }
        uVar4 = (ulong)(uint)((int)(uVar5 & 0xff) << 8) | uVar5 & 0xff;
        if (uVar2 != 3) {
          uVar4 = uVar5;
        }
        uVar5 = (ulong)(uint)((int)uVar4 << 0x10) | uVar4 & 0xffff;
        if (uVar8 != 4) {
          uVar5 = uVar4;
        }
        uVar4 = uVar5 << 0x20 | uVar5 & 0xffffffff;
        if (uVar1 != 5) {
          uVar4 = uVar5;
        }
        local_1070 = uVar4;
        if (uVar20 == 0) {
          uVar17 = 0;
        }
        else {
          uVar5 = 0;
          do {
            local_1018[uVar5] = auStack_fdc[(long)piVar10[uVar5] + 1];
            uVar5 = uVar5 + 1;
          } while (uVar20 != uVar5);
          uVar5 = 0;
          pwVar16 = s_Truths6Neg;
          uVar17 = 0;
          do {
            uVar2 = (uint)uVar5;
            local_1030 = uVar15;
            if ((*pwVar16 & (uVar4 >> ((byte)(1 << ((byte)uVar5 & 0x1f)) & 0x3f) ^ uVar4)) != 0) {
              if (((long)(int)uVar17 < (long)uVar5) &&
                 (local_1018[(int)uVar17] = local_1018[uVar5], uVar5 != uVar17)) {
                uVar8 = uVar17;
                if ((int)uVar17 < (int)uVar2) {
                  uVar8 = uVar2;
                }
                uVar1 = uVar17;
                if ((int)uVar2 < (int)uVar17) {
                  uVar1 = uVar2;
                }
                if ((int)uVar8 <= (int)uVar1) {
                  __assert_fail("iVar < jVar && jVar < nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
                }
                bVar6 = (char)(-1 << ((byte)uVar1 & 0x1f)) + (char)(1 << ((byte)uVar8 & 0x1f));
                uVar9 = (ulong)uVar8;
                lVar11 = (long)(int)uVar1 * 0x90;
                uVar4 = (uVar4 & *(ulong *)(lVar11 + 0x9b3310 + uVar9 * 0x18)) >> (bVar6 & 0x3f) |
                        (*(ulong *)(lVar11 + 0x9b3308 + uVar9 * 0x18) & uVar4) << (bVar6 & 0x3f) |
                        s_PPMasks[(int)uVar1][uVar9][0] & uVar4;
                pGia = local_1058;
                local_1070 = uVar4;
              }
              uVar17 = uVar17 + 1;
            }
            uVar5 = uVar5 + 1;
            pwVar16 = pwVar16 + 1;
          } while (uVar20 != uVar5);
        }
        if ((int)uVar20 < (int)uVar17) {
          __assert_fail("k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
        }
        if (uVar17 == 0) {
          uVar20 = (uint)local_1070 & 1;
        }
        else {
          local_1028.pArray = (int *)local_1018;
          local_1028.nCap = uVar17;
          local_1028.nSize = uVar17;
          uVar20 = Kit_TruthToGia((Gia_Man_t *)pGia,(uint *)&local_1070,uVar17,local_1038,
                                  &local_1028,1);
        }
        auStack_fdc[lVar13 + 1] = uVar20;
        uVar15 = uVar15 + uVar19;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x328,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar18 = (int)uVar15;
      lVar13 = lVar13 + 1;
      iVar3 = local_1060->nObjs;
      piVar10 = piVar10 + 0xc;
    } while (lVar13 < iVar3);
  }
  if (iVar18 != local_1064) {
    __assert_fail("iVar == nTtBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x32a,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (-1 < (int)auStack_fdc[iVar3]) {
    return auStack_fdc[iVar3] ^ (uint)((local_1048 >> (local_1040 & 0x3f) & 1) != 0);
  }
LAB_0043b904:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int If_ManSatDeriveGiaFromBits( void * pGia, Ifn_Ntk_t * p, word * pConfigData, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    Gia_Man_t * pNew = (Gia_Man_t *)pGia;
    int i, k, iLit, iVar = 0, nVarsNew, pVarMap[1000];
    int nTtBits = p->nParsVIni - p->nObjs;
    int nPermBits = Abc_Base2Log(p->nInps + 1) + 1;
    int fCompl = Abc_TtGetBit( pConfigData, nTtBits + nPermBits * p->nInps );
    assert( Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( iLit = k = 0; k < nPermBits; k++ )
            if ( Abc_TtGetBit(pConfigData, nTtBits + i * nPermBits + k) )
                iLit |= (1 << k);
        assert( Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves) );
        pVarMap[i] = Abc_Lit2LitL( Vec_IntArray(vLeaves), iLit );
    }
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        //int iFanin = p->Nodes[i].iFirst;
        assert( nFans <= 6 );
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int pFaninLits[16];
            // collect truth table
            word uTruth = 0;
            int nMints = (1 << nFans);
            for ( k = 0; k < nMints; k++ )
                if ( Abc_TtGetBit(pConfigData, iVar++) )
                    uTruth |= ((word)1 << k);
            uTruth = Abc_Tt6Stretch( uTruth, nFans );
            // collect function
            for ( k = 0; k < nFans; k++ )
                pFaninLits[k] = pVarMap[pFans[k]];
            // implement the function
            nVarsNew = Abc_TtMinBase( &uTruth, pFaninLits, nFans, 6 );
            if ( nVarsNew == 0 )
                pVarMap[i] = (int)(uTruth & 1);
            else
            {
                extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
                Vec_Int_t Leaves = { nVarsNew, nVarsNew, pFaninLits };
                pVarMap[i] = Kit_TruthToGia( pNew, (unsigned *)&uTruth, nVarsNew, vCover, &Leaves, 1 ); // hashing enabled!!!
            }
        }
        else assert( 0 );
    }
    assert( iVar == nTtBits );
    return Abc_LitNotCond( pVarMap[p->nObjs - 1], fCompl );
}